

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

ON__UINT32 __thiscall ON_String::DataCRC(ON_String *this,ON__UINT32 current_remainder)

{
  char *p;
  ON__UINT32 OVar1;
  size_t count;
  ON_Internal_Empty_aString *pOVar2;
  
  p = this->m_s;
  pOVar2 = &empty_astring;
  if (p != (char *)0x0) {
    pOVar2 = (ON_Internal_Empty_aString *)(p + -0xc);
  }
  count = (size_t)(pOVar2->header).string_length;
  if (0 < (long)count) {
    OVar1 = ON_CRC32(current_remainder,count,p);
    return OVar1;
  }
  return current_remainder;
}

Assistant:

ON_aStringHeader* ON_String::Header() const
{
  ON_aStringHeader* hdr = (ON_aStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_astring.header;
  return hdr;
}